

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O0

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::serializer<pstore::index::details::empty_class,void>::
write<pstore::serialize::archive::database_writer&>(database_writer *archive,value_type *param_2)

{
  archive_result_type<pstore::serialize::archive::database_writer_&> aVar1;
  pointer in_RCX;
  span<const_unsigned_char,__1L> sVar2;
  extent_type<_1L> local_38;
  extent_type<_1L> local_30;
  uchar local_21;
  value_type *pvStack_20;
  uint8_t dummy;
  value_type *param_1_local;
  database_writer *archive_local;
  
  local_21 = '\0';
  pvStack_20 = param_2;
  param_1_local = (value_type *)archive;
  sVar2 = gsl::make_span<unsigned_char_const>(&local_21,&local_21);
  local_38 = sVar2.storage_.super_extent_type<_1L>.size_;
  local_30.size_ = (index_type)sVar2.storage_.data_;
  sVar2.storage_.data_ = in_RCX;
  sVar2.storage_.super_extent_type<_1L>.size_ = local_30.size_;
  aVar1 = write<pstore::serialize::archive::database_writer&,unsigned_char_const,_1l>
                    ((serialize *)archive,(database_writer *)local_38.size_,sVar2);
  return (archive_result_type<pstore::serialize::archive::database_writer_&>)aVar1.a_;
}

Assistant:

static auto write (Archive && archive, value_type const &)
                -> archive_result_type<Archive> {
                // Tell the archiver to write an array of 0 elements. This should write
                // nothing at all but yield the location at which it would have gone (with the
                // correct type).
                auto const dummy = std::uint8_t{0};
                return serialize::write (std::forward<Archive> (archive),
                                         gsl::make_span (&dummy, &dummy));
            }